

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedLinearAllocator.hpp
# Opt level: O2

GraphicsPipelineData * __thiscall
Diligent::FixedLinearAllocator::
Construct<Diligent::PipelineStateBase<Diligent::EngineVkImplTraits>::GraphicsPipelineData>
          (FixedLinearAllocator *this)

{
  GraphicsPipelineData *this_00;
  
  this_00 = Allocate<Diligent::PipelineStateBase<Diligent::EngineVkImplTraits>::GraphicsPipelineData>
                      (this,1);
  BlendStateDesc::BlendStateDesc((BlendStateDesc *)this_00);
  (this_00->Desc).SampleMask = 0xffffffff;
  RasterizerStateDesc::RasterizerStateDesc(&(this_00->Desc).RasterizerDesc);
  DepthStencilStateDesc::DepthStencilStateDesc(&(this_00->Desc).DepthStencilDesc);
  (this_00->Desc).InputLayout.LayoutElements = (LayoutElement *)0x0;
  (this_00->Desc).InputLayout.NumElements = 0;
  (this_00->Desc).PrimitiveTopology = PRIMITIVE_TOPOLOGY_TRIANGLE_LIST;
  (this_00->Desc).NumViewports = '\x01';
  (this_00->Desc).NumRenderTargets = '\0';
  (this_00->Desc).SubpassIndex = '\0';
  (this_00->Desc).ShadingRateFlags = PIPELINE_SHADING_RATE_FLAG_NONE;
  (this_00->Desc).RTVFormats[0] = TEX_FORMAT_UNKNOWN;
  (this_00->Desc).RTVFormats[1] = TEX_FORMAT_UNKNOWN;
  (this_00->Desc).RTVFormats[2] = TEX_FORMAT_UNKNOWN;
  (this_00->Desc).RTVFormats[3] = TEX_FORMAT_UNKNOWN;
  (this_00->Desc).RTVFormats[4] = TEX_FORMAT_UNKNOWN;
  (this_00->Desc).RTVFormats[5] = TEX_FORMAT_UNKNOWN;
  (this_00->Desc).RTVFormats[6] = TEX_FORMAT_UNKNOWN;
  (this_00->Desc).RTVFormats[7] = TEX_FORMAT_UNKNOWN;
  *(undefined4 *)((long)(this_00->Desc).RTVFormats + 0xf) = 0;
  (this_00->Desc).SmplDesc.Count = '\x01';
  (this_00->Desc).SmplDesc.Quality = '\0';
  (this_00->Desc).pRenderPass = (IRenderPass *)0x0;
  (this_00->Desc).NodeMask = 0;
  this_00->dvpRenderTargetFormatsHash = 0;
  (this_00->pRenderPass).m_pObject = (IRenderPass *)0x0;
  this_00->pStrides = (Uint32 *)0x0;
  this_00->BufferSlotsUsed = '\0';
  return this_00;
}

Assistant:

NODISCARD T* Construct(Args&&... args)
    {
        T* Ptr = Allocate<T>();
        new (Ptr) T{std::forward<Args>(args)...};
        return Ptr;
    }